

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reinsertion_optimizer.h
# Opt level: O3

vector<unsigned_long,_std::allocator<unsigned_long>_> *
bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::
compute_parents<bvh::v2::ParallelExecutor>
          (vector<unsigned_long,_std::allocator<unsigned_long>_> *__return_storage_ptr__,
          Executor<bvh::v2::ParallelExecutor> *executor,
          Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_> *bvh)

{
  ulong uVar1;
  pointer puVar2;
  pointer pNVar3;
  pointer pNVar4;
  long lVar5;
  ulong uVar6;
  Index *pIVar7;
  unsigned_long uVar8;
  ulong uVar9;
  int *piVar10;
  _Any_data local_78;
  code *pcStack_68;
  code *pcStack_60;
  unique_lock<std::mutex> local_50;
  long local_40;
  Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_> *local_38;
  
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (__return_storage_ptr__,
             ((long)(bvh->nodes).
                    super__Vector_base<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_std::allocator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(bvh->nodes).
                    super__Vector_base<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_std::allocator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 2) * 0x6db6db6db6db6db7,
             (allocator_type *)local_78._M_pod_data);
  puVar2 = (__return_storage_ptr__->
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_start;
  *puVar2 = 0;
  pNVar3 = (bvh->nodes).
           super__Vector_base<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_std::allocator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pNVar4 = (bvh->nodes).
           super__Vector_base<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_std::allocator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar9 = ((long)pNVar3 - (long)pNVar4 >> 2) * 0x6db6db6db6db6db7;
  if (uVar9 < *(ulong *)(executor + 8)) {
    if (pNVar3 != pNVar4) {
      pIVar7 = &pNVar4->index;
      uVar8 = 0;
      do {
        if ((pIVar7->value & 0xf) == 0) {
          uVar6 = (ulong)(pIVar7->value >> 4);
          puVar2[uVar6] = uVar8;
          puVar2[uVar6 + 1] = uVar8;
        }
        uVar8 = uVar8 + 1;
        pIVar7 = pIVar7 + 7;
      } while (uVar9 - uVar8 != 0);
    }
  }
  else {
    piVar10 = *(int **)executor;
    uVar6 = uVar9 / (ulong)(*(long *)(piVar10 + 0xe) - *(long *)(piVar10 + 0xc) >> 3);
    local_40 = uVar6 + (uVar6 == 0);
    local_38 = bvh;
    if (pNVar3 != pNVar4) {
      uVar6 = 0;
      do {
        lVar5 = *(long *)executor;
        local_78._M_unused._M_object = (void *)0x0;
        local_78._8_8_ = 0;
        pcStack_68 = (code *)0x0;
        pcStack_60 = (code *)0x0;
        local_78._M_unused._M_object = operator_new(0x20);
        uVar1 = uVar6 + local_40;
        *(Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_> **)local_78._M_unused._0_8_ = local_38;
        *(vector<unsigned_long,_std::allocator<unsigned_long>_> **)
         ((long)local_78._M_unused._0_8_ + 8) = __return_storage_ptr__;
        *(ulong *)((long)local_78._M_unused._0_8_ + 0x10) = uVar6;
        uVar6 = uVar9;
        if (uVar1 < uVar9) {
          uVar6 = uVar1;
        }
        *(ulong *)((long)local_78._M_unused._0_8_ + 0x18) = uVar6;
        pcStack_60 = std::
                     _Function_handler<void_(unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/madmann91[P]bvh/src/bvh/v2/executor.h:58:30)>
                     ::_M_invoke;
        local_50._M_device = (mutex_type *)(lVar5 + 8);
        pcStack_68 = std::
                     _Function_handler<void_(unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/madmann91[P]bvh/src/bvh/v2/executor.h:58:30)>
                     ::_M_manager;
        local_50._M_owns = false;
        std::unique_lock<std::mutex>::lock(&local_50);
        local_50._M_owns = true;
        std::
        deque<std::function<void(unsigned_long)>,std::allocator<std::function<void(unsigned_long)>>>
        ::emplace_back<std::function<void(unsigned_long)>>
                  ((deque<std::function<void(unsigned_long)>,std::allocator<std::function<void(unsigned_long)>>>
                    *)(lVar5 + 0xa8),(function<void_(unsigned_long)> *)&local_78);
        std::unique_lock<std::mutex>::~unique_lock(&local_50);
        std::condition_variable::notify_one();
        if (pcStack_68 != (code *)0x0) {
          (*pcStack_68)(&local_78,&local_78,__destroy_functor);
        }
        uVar6 = uVar1;
      } while (uVar1 < uVar9);
      piVar10 = *(int **)executor;
    }
    local_78._M_unused._M_object = piVar10 + 2;
    local_78._8_8_ = local_78._8_8_ & 0xffffffffffffff00;
    std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)&local_78);
    local_78._M_pod_data[8] = 1;
    while ((*piVar10 != 0 || (*(long *)(piVar10 + 0x36) != *(long *)(piVar10 + 0x2e)))) {
      std::condition_variable::wait((unique_lock *)(piVar10 + 0x1e));
    }
    std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)&local_78);
  }
  return __return_storage_ptr__;
}

Assistant:

static std::vector<size_t> compute_parents(Executor<Derived>& executor, const Bvh<Node>& bvh) {
        std::vector<size_t> parents(bvh.nodes.size());
        parents[0] = 0;
        executor.for_each(0, bvh.nodes.size(),
            [&] (size_t begin, size_t end) {
                for (size_t i = begin; i < end; ++i) {
                    auto& node = bvh.nodes[i];
                    if (!node.is_leaf()) {
                        parents[node.index.first_id() + 0] = i;
                        parents[node.index.first_id() + 1] = i;
                    }
                }
            });
        return parents;
    }